

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int apiHandleError(sqlite3 *db,int rc)

{
  int rc_local;
  sqlite3 *db_local;
  
  if ((db->mallocFailed == '\0') && (rc != 0xc0a)) {
    db_local._4_4_ = rc & db->errMask;
  }
  else {
    sqlite3OomClear(db);
    sqlite3Error(db,7);
    db_local._4_4_ = 7;
  }
  return db_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int apiHandleError(sqlite3 *db, int rc){
  if( db->mallocFailed || rc==SQLITE_IOERR_NOMEM ){
    sqlite3OomClear(db);
    sqlite3Error(db, SQLITE_NOMEM);
    return SQLITE_NOMEM_BKPT;
  }
  return rc & db->errMask;
}